

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void putArray(Array a,Data c)

{
  element *peVar1;
  element *el;
  Data c_local;
  Array a_local;
  
  peVar1 = (element *)malloc(0x10);
  peVar1->data = c;
  peVar1->next = (element *)0x0;
  if (a->length == 0) {
    a->head = peVar1;
  }
  else {
    a->tail->next = peVar1;
  }
  a->tail = peVar1;
  a->length = a->length + 1;
  return;
}

Assistant:

void putArray(Array a, Data c) {
    struct element *el = malloc(sizeof(struct element));
    el->data = c;
    el->next = NULL;

    if (a->length == 0) {
        a->head = el;
    } else {
        a->tail->next = el;
    }

    a->tail = el;
    a->length++;
}